

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Error cf2_getSeacComponent(PS_Decoder *decoder,FT_Fast code,CF2_Buffer buf)

{
  FT_Byte *local_50;
  FT_ULong FStack_40;
  FT_Error error;
  FT_ULong len;
  FT_Byte *charstring;
  CF2_Buffer pCStack_28;
  FT_Fast gid;
  CF2_Buffer buf_local;
  PS_Decoder *pPStack_18;
  FT_Fast code_local;
  PS_Decoder *decoder_local;
  
  pCStack_28 = buf;
  buf_local._4_4_ = code;
  pPStack_18 = decoder;
  memset(buf,0,0x20);
  if (((pPStack_18->builder).face)->internal->incremental_interface ==
      (FT_Incremental_InterfaceRec *)0x0) {
    charstring._4_4_ = cff_lookup_glyph_by_stdcharcode(pPStack_18->cff,buf_local._4_4_);
    if ((int)charstring._4_4_ < 0) {
      return 0x12;
    }
  }
  else {
    charstring._4_4_ = buf_local._4_4_;
  }
  decoder_local._4_4_ =
       (*pPStack_18->get_glyph_callback)
                 ((TT_Face)(pPStack_18->builder).face,charstring._4_4_,(FT_Byte **)&len,
                  &stack0xffffffffffffffc0);
  if (decoder_local._4_4_ == 0) {
    pCStack_28->start = (FT_Byte *)len;
    if (len == 0) {
      local_50 = (FT_Byte *)0x0;
    }
    else {
      local_50 = (FT_Byte *)(len + FStack_40);
    }
    pCStack_28->end = local_50;
    pCStack_28->ptr = pCStack_28->start;
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getSeacComponent( PS_Decoder*  decoder,
                        CF2_Int      code,
                        CF2_Buffer   buf )
  {
    CF2_Int   gid;
    FT_Byte*  charstring;
    FT_ULong  len;
    FT_Error  error;


    FT_ASSERT( decoder );
    FT_ASSERT( !decoder->builder.is_t1 );

    FT_ZERO( buf );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* Incremental fonts don't necessarily have valid charsets.        */
    /* They use the character code, not the glyph index, in this case. */
    if ( decoder->builder.face->internal->incremental_interface )
      gid = code;
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
    {
      gid = cff_lookup_glyph_by_stdcharcode( decoder->cff, code );
      if ( gid < 0 )
        return FT_THROW( Invalid_Glyph_Format );
    }

    error = decoder->get_glyph_callback( (TT_Face)decoder->builder.face,
                                         (CF2_UInt)gid,
                                         &charstring,
                                         &len );
    /* TODO: for now, just pass the FreeType error through */
    if ( error )
      return error;

    /* assume input has been validated */
    FT_ASSERT( charstring + len >= charstring );

    buf->start = charstring;
    buf->end   = FT_OFFSET( charstring, len );
    buf->ptr   = buf->start;

    return FT_Err_Ok;
  }